

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pcache1TruncateUnsafe(PCache1 *pCache,uint iLimit)

{
  uint *puVar1;
  PgHdr1 *pPVar2;
  uint uVar3;
  ulong uVar4;
  PgHdr1 *p;
  PgHdr1 **ppPVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = pCache->nHash;
  if (pCache->iMaxKey - iLimit < uVar6) {
    uVar7 = (ulong)iLimit % (ulong)uVar6;
    uVar4 = (ulong)pCache->iMaxKey % (ulong)uVar6;
  }
  else {
    uVar4 = (ulong)((uVar6 >> 1) - 1);
    uVar7 = (ulong)(uVar6 >> 1);
  }
  do {
    uVar6 = (uint)uVar7;
    p = pCache->apHash[uVar7];
    if (p != (PgHdr1 *)0x0) {
      ppPVar5 = pCache->apHash + uVar7;
      do {
        if (p->iKey < iLimit) {
          ppPVar5 = &p->pNext;
        }
        else {
          pCache->nPage = pCache->nPage - 1;
          *ppPVar5 = p->pNext;
          if (p->pLruNext != (PgHdr1 *)0x0) {
            pPVar2 = p->pLruPrev;
            pPVar2->pLruNext = p->pLruNext;
            p->pLruNext->pLruPrev = pPVar2;
            p->pLruNext = (PgHdr1 *)0x0;
            puVar1 = &p->pCache->nRecyclable;
            *puVar1 = *puVar1 - 1;
          }
          pcache1FreePage(p);
        }
        p = *ppPVar5;
      } while (p != (PgHdr1 *)0x0);
    }
    uVar3 = uVar6;
    if (uVar6 != (uint)uVar4) {
      uVar3 = (uVar6 + 1) % pCache->nHash;
    }
    uVar7 = (ulong)uVar3;
  } while (uVar6 != (uint)uVar4);
  return;
}

Assistant:

static void pcache1TruncateUnsafe(
  PCache1 *pCache,             /* The cache to truncate */
  unsigned int iLimit          /* Drop pages with this pgno or larger */
){
  TESTONLY( int nPage = 0; )  /* To assert pCache->nPage is correct */
  unsigned int h, iStop;
  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  assert( pCache->iMaxKey >= iLimit );
  assert( pCache->nHash > 0 );
  if( pCache->iMaxKey - iLimit < pCache->nHash ){
    /* If we are just shaving the last few pages off the end of the
    ** cache, then there is no point in scanning the entire hash table.
    ** Only scan those hash slots that might contain pages that need to
    ** be removed. */
    h = iLimit % pCache->nHash;
    iStop = pCache->iMaxKey % pCache->nHash;
    TESTONLY( nPage = -10; )  /* Disable the pCache->nPage validity check */
  }else{
    /* This is the general case where many pages are being removed.
    ** It is necessary to scan the entire hash table */
    h = pCache->nHash/2;
    iStop = h - 1;
  }
  for(;;){
    PgHdr1 **pp;
    PgHdr1 *pPage;
    assert( h<pCache->nHash );
    pp = &pCache->apHash[h]; 
    while( (pPage = *pp)!=0 ){
      if( pPage->iKey>=iLimit ){
        pCache->nPage--;
        *pp = pPage->pNext;
        if( PAGE_IS_UNPINNED(pPage) ) pcache1PinPage(pPage);
        pcache1FreePage(pPage);
      }else{
        pp = &pPage->pNext;
        TESTONLY( if( nPage>=0 ) nPage++; )
      }
    }
    if( h==iStop ) break;
    h = (h+1) % pCache->nHash;
  }
  assert( nPage<0 || pCache->nPage==(unsigned)nPage );
}